

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

int trex_parsenumber(TRex *exp)

{
  ushort **ppuVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  
  iVar2 = (int)*exp->_p;
  pcVar3 = exp->_p + 1;
  exp->_p = pcVar3;
  iVar4 = 10;
  ppuVar1 = __ctype_b_loc();
  while( true ) {
    if ((*(byte *)((long)*ppuVar1 + (long)*pcVar3 * 2 + 1) & 8) == 0) {
      return iVar2 + -0x30;
    }
    exp->_p = pcVar3 + 1;
    if (iVar4 == 1000000000) break;
    iVar2 = (iVar2 + -0x30) * 10 + (int)*pcVar3;
    iVar4 = iVar4 * 10;
    pcVar3 = pcVar3 + 1;
  }
  trex_error(exp,"overflow in numeric constant");
}

Assistant:

static int trex_parsenumber(TRex * exp) {
	int ret = *exp->_p - '0';
	int positions = 10;
	exp->_p++;

	while (isdigit(*exp->_p)) {
		ret = ret * 10 + (*exp->_p++ -'0');

		if (positions == 1000000000) {
			trex_error(exp, _SC("overflow in numeric constant"));
		}

		positions *= 10;
	};

	return ret;
}